

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O2

void __thiscall RenX_ChatLogPlugin::~RenX_ChatLogPlugin(RenX_ChatLogPlugin *this)

{
  char cVar1;
  
  *(undefined ***)this = &PTR_think_0010b848;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_0010bd28;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::fstream::close();
  }
  std::fstream::~fstream(&this->fs);
  std::__cxx11::string::~string((string *)&this->last_date);
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ChatLogPlugin::~RenX_ChatLogPlugin()
{
	if (fs.is_open()) {
		fs.close();
	}
}